

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_XXX.cpp
# Opt level: O0

void __thiscall EnvironmentXXX::CreateStartandGoalStates(EnvironmentXXX *this)

{
  undefined4 *puVar1;
  long *in_RDI;
  uint X4;
  uint X3;
  uint X2;
  uint X1;
  EnvXXXHashEntry_t *HashEntry;
  
  puVar1 = (undefined4 *)(**(code **)(*in_RDI + 0x108))(in_RDI,0,0,0,0);
  *(undefined4 *)(in_RDI + 9) = *puVar1;
  puVar1 = (undefined4 *)(**(code **)(*in_RDI + 0x108))(in_RDI,1,1,1,1);
  *(undefined4 *)((long)in_RDI + 0x4c) = *puVar1;
  return;
}

Assistant:

void EnvironmentXXX::CreateStartandGoalStates()
{
    EnvXXXHashEntry_t* HashEntry;

    //create start state
    unsigned int X1 = 0;
    unsigned int X2 = 0;
    unsigned int X3 = 0;
    unsigned int X4 = 0;
    HashEntry = CreateNewHashEntry(X1, X2, X3, X4);
    EnvXXX.startstateid = HashEntry->stateID;

    //create goal state
    X1 = X2 = X3 = X4 = 1;
    HashEntry = CreateNewHashEntry(X1, X2, X3, X4);
    EnvXXX.goalstateid = HashEntry->stateID;
}